

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O2

uint scan_uint(char *str)

{
  uint uVar1;
  
  uVar1 = 0;
  while( true ) {
    if ((byte)(*str - 0x3aU) < 0xf6) break;
    uVar1 = (uint)(byte)(*str - 0x30) + uVar1 * 10;
    str = str + 1;
  }
  return uVar1;
}

Assistant:

static unsigned int scan_uint(const char *str) {
    const char *s = str;
    unsigned int num = 0;
    while(*s) {
        if(*s < 48 || *s > 57) break;
        num *= 10;
        num += (*s - 48);
        s++;
    }

    return num;
}